

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::CharSet<char16_t>::IsEqualTo(CharSet<char16_t> *this,CharSet<char16_t> *other)

{
  CharSetNode *pCVar1;
  bool bVar2;
  Char kc;
  uint uVar3;
  int iVar4;
  uint local_24;
  uint i;
  CharSet<char16_t> *other_local;
  CharSet<char16_t> *this_local;
  
  bVar2 = IsCompact(this);
  if (bVar2) {
    bVar2 = IsCompact(other);
    if (bVar2) {
      if ((this->rep).compact.countPlusOne == (other->rep).compact.countPlusOne) {
        for (local_24 = 0; uVar3 = GetCompactLength(this), local_24 < uVar3; local_24 = local_24 + 1
            ) {
          kc = GetCompactChar(this,local_24);
          bVar2 = Get(other,kc);
          if (!bVar2) {
            return false;
          }
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    bVar2 = IsCompact(other);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      bVar2 = CharBitvec::IsEqualTo(&(this->rep).full.direct,&(other->rep).full.direct);
      if (bVar2) {
        if (((this->rep).compact.countPlusOne == 0) == ((other->rep).compact.countPlusOne == 0)) {
          if ((this->rep).compact.countPlusOne == 0) {
            this_local._7_1_ = true;
          }
          else {
            pCVar1 = (this->rep).full.root;
            iVar4 = (*pCVar1->_vptr_CharSetNode[10])(pCVar1,2,(other->rep).compact.countPlusOne);
            this_local._7_1_ = (bool)((byte)iVar4 & 1);
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CharSet<char16>::IsEqualTo(const CharSet<Char>& other) const
    {
        if (IsCompact())
        {
            if (!other.IsCompact())
                return false;
            if (rep.compact.countPlusOne != other.rep.compact.countPlusOne)
                return false;
            for (uint i = 0; i < this->GetCompactLength(); i++)
            {
                if (!other.Get(this->GetCompactChar(i)))
                    return false;
            }
            return true;
        }
        else
        {
            if (other.IsCompact())
                return false;
            if (!rep.full.direct.IsEqualTo(other.rep.full.direct))
                return false;
            if ((rep.full.root == nullptr) != (other.rep.full.root == nullptr))
                return false;
            if (rep.full.root == nullptr)
                return true;
            return rep.full.root->IsEqualTo(CharSetNode::levels - 1, other.rep.full.root);
        }
    }